

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.cpp
# Opt level: O3

void __thiscall cppurses::Terminal::initialize_color_pairs(Terminal *this)

{
  short sVar1;
  byte bVar2;
  short sVar3;
  uint uVar4;
  short bg;
  short sVar5;
  int iVar6;
  
  iVar6 = (uint)(byte)(0xf < _COLORS & this->is_initialized_) * 8 + 8;
  uVar4 = 0;
  do {
    sVar5 = 0;
    sVar1 = (short)uVar4;
    do {
      if (sVar1 != 7 || sVar5 != 0) {
        sVar3 = 0x80;
        if (sVar1 != 0xf || sVar5 != 0) {
          bVar2 = 0xf < _COLORS & this->is_initialized_;
          sVar3 = (short)(~uVar4 + 8 + (uint)bVar2 * 8 << bVar2 + 3) + sVar5;
          if (sVar3 == 0) goto LAB_00149a87;
        }
        init_pair((int)sVar3,(int)sVar1,(int)sVar5);
      }
LAB_00149a87:
      sVar5 = sVar5 + 1;
    } while (sVar5 < iVar6);
    uVar4 = uVar4 + 1;
    if (iVar6 <= (short)uVar4) {
      return;
    }
  } while( true );
}

Assistant:

bool Terminal::has_extended_colors() const
{
    if (is_initialized_)
        return COLORS >= 16;
    return false;
}